

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcompleter_p.cpp
# Opt level: O0

void QCompletionModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QtMocHelpers *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  QCompletionModel *_t;
  QCompletionModel *in_stack_ffffffffffffffd0;
  
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      rowsAdded((QCompletionModel *)0xa709f8);
      break;
    case 1:
      invalidate(in_stack_ffffffffffffffd0);
      break;
    case 2:
      rowsInserted(in_stack_ffffffffffffffd0);
      break;
    case 3:
      modelDestroyed(in_stack_ffffffffffffffd0);
    }
  }
  if (in_ESI == 5) {
    QtMocHelpers::indexOfMethod<void(QCompletionModel::*)()>(in_RCX,(void **)rowsAdded,0,0);
  }
  return;
}

Assistant:

void QCompletionModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCompletionModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->rowsAdded(); break;
        case 1: _t->invalidate(); break;
        case 2: _t->rowsInserted(); break;
        case 3: _t->modelDestroyed(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCompletionModel::*)()>(_a, &QCompletionModel::rowsAdded, 0))
            return;
    }
}